

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateFunctionDefinition
          (ExpressionContext *ctx,SynBase *source,bool prototype,bool coroutine,TypeBase *parentType
          ,bool accessor,TypeBase *returnType,bool isOperator,SynIdentifier *name,
          IntrusiveList<SynIdentifier> aliases,IntrusiveList<SynFunctionArgument> arguments,
          IntrusiveList<SynBase> expressions,FunctionData *genericProto,TypeFunction *instance,
          IntrusiveList<MatchData> matches)

{
  Allocator *pAVar1;
  ArgumentData *pAVar2;
  long lVar3;
  FunctionData **ppFVar4;
  ExprBase **ppEVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  IntrusiveList<MatchData> generics_00;
  ExprBase *pEVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  SynIdentifier *source_00;
  TypeBase *pTVar14;
  TypeGenericAlias *pTVar15;
  undefined4 extraout_var;
  TypeRef *pTVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypeFunction *pTVar18;
  IdentifierLookupResult *pIVar19;
  SynIdentifier *pSVar20;
  FunctionData *pFVar21;
  FunctionData *pFVar22;
  SynFunctionDefinition *pSVar23;
  undefined4 extraout_var_04;
  char *pcVar24;
  size_t sVar25;
  AliasData *alias;
  SynBase *pSVar26;
  ExprVariableDefinition *pEVar27;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ExprBase *pEVar28;
  undefined4 extraout_var_08;
  _func_int **pp_Var29;
  SynBase *pSVar30;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  VariableHandle *pVVar31;
  undefined4 extraout_var_14;
  VariableData *pVVar32;
  ExprVariableDefinition *pEVar33;
  Lexeme **ppLVar34;
  long lVar35;
  MatchData *pMVar36;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  ExpressionContext *this;
  ScopeData *pSVar40;
  MatchData *pMVar41;
  SynIdentifier *pSVar42;
  FunctionData *parentType_00;
  undefined8 *puVar43;
  TypeClass *classType;
  bool bVar44;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr name_00;
  ArrayView<ArgumentData> arguments_01;
  IntrusiveList<SynFunctionArgument> arguments_02;
  ArrayView<ArgumentData> argData_00;
  InplaceStr IVar45;
  InplaceStr parentName;
  IntrusiveList<ExprBase> code;
  IntrusiveList<MatchData> generics;
  TraceScope traceScope;
  IntrusiveList<ExprVariableDefinition> variables;
  SmallArray<ArgumentData,_8U> argData;
  char *local_280;
  ExprBase *local_270;
  FunctionLookupChain local_268;
  InplaceStr *local_248;
  TypeRef *local_240;
  undefined8 local_238;
  TypeFunction *local_230;
  IntrusiveList<ExprBase> local_228;
  FunctionLookupChain local_218;
  IntrusiveList<MatchData> local_1f8;
  TraceScope local_1e8;
  IntrusiveList<ExprVariableDefinition> local_1d8;
  undefined1 local_1c8 [24];
  undefined8 auStack_1b0 [47];
  Allocator *local_38;
  MatchData *pMVar16;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_05;
  undefined4 extraout_var_09;
  undefined4 extraout_var_13;
  
  source_00 = name;
  if ((name->super_SynBase).begin == (Lexeme *)0x0) {
    source_00 = (SynIdentifier *)source;
  }
  bVar9 = RestoreParentTypeScope(ctx,source,parentType);
  parentType_00 = (FunctionData *)ctx->scope->ownerType;
  if (parentType_00 == (FunctionData *)0x0) {
    parentType_00 = (FunctionData *)parentType;
  }
  if (parentType != (TypeBase *)0x0) {
    parentType_00 = (FunctionData *)parentType;
  }
  if (parentType_00 != (FunctionData *)0x0 && coroutine) {
    pcVar24 = "ERROR: coroutine cannot be a member function";
    pSVar20 = source_00;
LAB_001fd99b:
    anon_unknown.dwarf_11255e::Stop(ctx,&pSVar20->super_SynBase,pcVar24);
  }
  local_1f8.head = (MatchData *)0x0;
  local_1f8.tail = (MatchData *)0x0;
  if (aliases.head != (SynIdentifier *)0x0) {
    pSVar20 = aliases.head;
    do {
      uVar11 = NULLC::GetStringHash((pSVar20->name).begin,(pSVar20->name).end);
      pTVar14 = anon_unknown.dwarf_11255e::LookupTypeByName(ctx,uVar11);
      if (pTVar14 != (TypeBase *)0x0) {
        pcVar24 = "ERROR: there is already a type with the same name";
        goto LAB_001fd99b;
      }
      pMVar16 = matches.head;
      pSVar42 = aliases.head;
      if (aliases.head != pSVar20 && aliases.head != (SynIdentifier *)0x0) {
        do {
          bVar10 = InplaceStr::operator==(&pSVar42->name,&pSVar20->name);
          if (bVar10) {
            pcVar24 = "ERROR: there is already an alias with the same name";
            goto LAB_001fd99b;
          }
          pSVar42 = (SynIdentifier *)(pSVar42->super_SynBase).next;
          if ((pSVar42 == (SynIdentifier *)0x0) || ((pSVar42->super_SynBase).typeID != 4)) {
            pSVar42 = (SynIdentifier *)0x0;
          }
        } while ((pSVar42 != (SynIdentifier *)0x0) && (pSVar42 != pSVar20));
      }
      for (; pMVar16 != (MatchData *)0x0; pMVar16 = pMVar16->next) {
        bVar10 = InplaceStr::operator==(&pSVar20->name,&pMVar16->name->name);
        if (bVar10) {
          pTVar15 = (TypeGenericAlias *)pMVar16->type;
          goto LAB_001fc377;
        }
      }
      pTVar15 = (TypeGenericAlias *)0x0;
LAB_001fc377:
      if (pTVar15 == (TypeGenericAlias *)0x0) {
        pTVar15 = ExpressionContext::GetGenericAliasType(ctx,pSVar20);
      }
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pMVar16 = (MatchData *)CONCAT44(extraout_var,iVar12);
      pMVar16->name = pSVar20;
      pMVar16->type = &pTVar15->super_TypeBase;
      pMVar16->next = (MatchData *)0x0;
      pMVar16->listed = false;
      IntrusiveList<MatchData>::push_back(&local_1f8,pMVar16);
      pSVar20 = (SynIdentifier *)(pSVar20->super_SynBase).next;
      if ((pSVar20 == (SynIdentifier *)0x0) || ((pSVar20->super_SynBase).typeID != 4)) {
        pSVar20 = (SynIdentifier *)0x0;
      }
    } while (pSVar20 != (SynIdentifier *)0x0);
  }
  pAVar1 = ctx->allocator;
  lVar35 = 0x20;
  do {
    *(undefined8 *)((long)&local_1d8.head + lVar35) = 0;
    local_1c8[lVar35 + -8] = 0;
    *(undefined8 *)(local_1c8 + lVar35) = 0;
    *(undefined8 *)(local_1c8 + lVar35 + 8) = 0;
    *(undefined8 *)(local_1c8 + lVar35 + 0x10) = 0;
    *(undefined8 *)((long)auStack_1b0 + lVar35) = 0;
    lVar35 = lVar35 + 0x30;
  } while (lVar35 != 0x1a0);
  local_1c8._0_8_ = local_1c8 + 0x10;
  local_1c8._8_4_ = 0;
  local_1c8._12_4_ = 8;
  arguments_02.tail = (SynFunctionArgument *)local_1c8._0_8_;
  arguments_02.head = arguments.head;
  local_38 = pAVar1;
  AnalyzeFunctionDefinitionArguments
            (ctx,arguments_02,(TypeBase *)parentType_00,instance,
             (SmallArray<ArgumentData,_8U> *)local_1c8);
  if (isOperator) {
    argData_00.count = local_1c8._8_4_;
    argData_00.data = (ArgumentData *)local_1c8._0_8_;
    argData_00._12_4_ = 0;
    CheckOperatorName(ctx,source,name->name,argData_00);
  }
  if ((accessor) &&
     (bVar10 = InplaceStr::operator==(&name->name,(InplaceStr *)&parentType_00->isInternal), bVar10)
     ) {
    anon_unknown.dwarf_11255e::Stop
              (ctx,&source_00->super_SynBase,"ERROR: name \'%.*s\' is already taken for a type",
               (ulong)(uint)(*(int *)&(name->name).end - (int)(name->name).begin));
  }
  if ((name->name).begin == (name->name).end) {
    IVar45 = GetTemporaryFunctionName(ctx);
    local_280 = IVar45.end;
  }
  else {
    IVar45 = GetFunctionNameInScope
                       (ctx,ctx->scope,(TypeBase *)parentType_00,name->name,isOperator,accessor);
    local_280 = IVar45.end;
  }
  pcVar24 = IVar45.begin;
  if ((CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
       ::token == '\0') &&
     (iVar12 = __cxa_guard_acquire(&CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
                                    ::token), iVar12 != 0)) {
    CreateFunctionDefinition::token = NULLC::TraceGetToken("analyze","CreateFunctionDefinition");
    __cxa_guard_release(&CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
                         ::token);
  }
  local_238 = (TypeBase *)CONCAT44(local_238._4_4_,(uint)accessor);
  NULLC::TraceScope::TraceScope(&local_1e8,CreateFunctionDefinition::token);
  pEVar8 = NULLC::traceContext;
  iVar12 = (int)((long)local_280 - (long)pcVar24);
  pEVar28 = (ExprBase *)(ulong)isOperator;
  if (iVar12 != 0) {
    uVar11 = iVar12 + 1;
    if ((*(uint *)((long)&NULLC::traceContext[0xc].next + 4) <=
         *(int *)&NULLC::traceContext[0xc].next + uVar11) ||
       (*(int *)&NULLC::traceContext[0xd]._vptr_ExprBase ==
        *(int *)((long)&NULLC::traceContext[0xd]._vptr_ExprBase + 4))) {
      NULLC::TraceDump();
    }
    if (*(uint *)((long)&pEVar8[0xc].next + 4) <= uVar11) {
      __assert_fail("count + 1 < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
    }
    uVar13 = *(uint *)&pEVar8[0xc].next;
    memcpy((void *)((ulong)uVar13 + *(long *)&pEVar8[0xc].listed),pcVar24,
           (long)local_280 - (long)pcVar24 & 0xffffffff);
    *(undefined1 *)
     (*(long *)&pEVar8[0xc].listed + (ulong)(uint)(*(int *)&pEVar8[0xc].next + iVar12)) = 0;
    *(uint *)&pEVar8[0xc].next = *(int *)&pEVar8[0xc].next + uVar11;
    lVar35 = *(long *)&pEVar8[0xd].typeID;
    uVar11 = *(uint *)&pEVar8[0xd]._vptr_ExprBase;
    *(uint *)&pEVar8[0xd]._vptr_ExprBase = uVar11 + 1;
    *(uint *)(lVar35 + (ulong)uVar11 * 8) = uVar13 * 4 + 2;
    *(undefined4 *)(lVar35 + 4 + (ulong)uVar11 * 8) = 0;
    pEVar28 = pEVar8;
  }
  if (parentType_00 == (FunctionData *)0x0) {
    if ((coroutine) ||
       ((ctx->scope != ctx->globalScope && (ctx->scope->ownerNamespace == (NamespaceData *)0x0)))) {
      IVar45.end = local_280;
      IVar45.begin = pcVar24;
      pTVar14 = CreateFunctionContextType(ctx,source,IVar45);
    }
    else {
      pTVar14 = ctx->typeVoid;
    }
    pTVar17 = ExpressionContext::GetReferenceType(ctx,pTVar14);
  }
  else {
    pTVar17 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)parentType_00);
  }
  if ((returnType != (TypeBase *)0x0) && (returnType->typeID == 0)) {
    if (bVar9) {
      ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
    }
    iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar28 = (ExprBase *)CONCAT44(extraout_var_00,iVar12);
    pTVar14 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar28->typeID = 0;
    pEVar28->source = source;
    pEVar28->type = pTVar14;
    pEVar28->next = (ExprBase *)0x0;
    pEVar28->listed = false;
    pEVar28->_vptr_ExprBase = (_func_int **)&PTR__ExprError_003f6638;
    pEVar28[2]._vptr_ExprBase = (_func_int **)0x0;
    pEVar28[1]._vptr_ExprBase = (_func_int **)&pEVar28[1].source;
    *(undefined8 *)&pEVar28[1].typeID = 0x400000000;
    goto LAB_001fd92b;
  }
  uVar37 = (ulong)(uint)local_1c8._8_4_;
  bVar10 = uVar37 != 0;
  local_240 = pTVar17;
  if (bVar10) {
    ppLVar34 = &((SynBase *)local_1c8._0_8_)->end;
    uVar38 = 1;
    do {
      if ((*ppLVar34 != (Lexeme *)0x0) && (*(int *)&(*ppLVar34)->pos == 0)) {
        if (bVar9) {
          ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
        }
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        pEVar28 = (ExprBase *)CONCAT44(extraout_var_01,iVar12);
        pTVar14 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        pEVar28->typeID = 0;
        pEVar28->source = source;
        pEVar28->type = pTVar14;
        pEVar28->next = (ExprBase *)0x0;
        pEVar28->listed = false;
        pEVar28->_vptr_ExprBase = (_func_int **)&PTR__ExprError_003f6638;
        pEVar28[2]._vptr_ExprBase = (_func_int **)0x0;
        pEVar28[1]._vptr_ExprBase = (_func_int **)&pEVar28[1].source;
        *(undefined8 *)&pEVar28[1].typeID = 0x400000000;
        break;
      }
      bVar10 = uVar38 < uVar37;
      ppLVar34 = ppLVar34 + 6;
      bVar44 = uVar38 != uVar37;
      uVar38 = uVar38 + 1;
    } while (bVar44);
  }
  if (bVar10) goto LAB_001fd92b;
  arguments_00.count = local_1c8._8_4_;
  arguments_00.data = (ArgumentData *)local_1c8._0_8_;
  arguments_00._12_4_ = 0;
  pTVar18 = ExpressionContext::GetFunctionType(ctx,source,returnType,arguments_00);
  if (pTVar18 != instance && instance != (TypeFunction *)0x0) {
    __assert_fail("functionType == instance",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x236c,
                  "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                 );
  }
  uVar11 = NULLC::GetStringHash(pcVar24,local_280);
  pIVar19 = anon_unknown.dwarf_11255e::LookupObjectByName(ctx,uVar11);
  if ((pIVar19 == (IdentifierLookupResult *)0x0) ||
     (pVVar32 = pIVar19->variable, pVVar32 == (VariableData *)0x0)) {
    pVVar32 = (VariableData *)0x0;
  }
  if ((pVVar32 != (VariableData *)0x0) && (pVVar32->scope == ctx->scope)) {
    anon_unknown.dwarf_11255e::Stop
              (ctx,&source_00->super_SynBase,
               "ERROR: name \'%.*s\' is already taken for a variable in current scope",
               (ulong)(uint)(*(int *)&(name->name).end - (int)(name->name).begin));
  }
  if ((parentType_00 == (FunctionData *)0x0) ||
     (pFVar21 = parentType_00, *(int *)&parentType_00->importModule != 0x18)) {
    pFVar21 = (FunctionData *)0x0;
  }
  local_248 = &name->name;
  local_230 = pTVar18;
  if (pFVar21 != (FunctionData *)0x0) {
    local_268.node.node = (Node *)"";
    local_268.node.start = (Node *)"finalize";
    bVar10 = InplaceStr::operator==(local_248,(InplaceStr *)&local_268);
    if (bVar10) {
      *(undefined1 *)((long)&(pFVar21->arguments).little[3].name + 2) = 1;
    }
  }
  iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  pSVar20 = (SynIdentifier *)CONCAT44(extraout_var_02,iVar12);
  SynBase::SynBase((SynBase *)pSVar20,4,(name->super_SynBase).begin,(name->super_SynBase).end);
  (pSVar20->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
  (pSVar20->name).begin = pcVar24;
  (pSVar20->name).end = local_280;
  iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
  pFVar21 = (FunctionData *)CONCAT44(extraout_var_03,iVar12);
  uVar11 = ctx->uniqueFunctionId;
  ctx->uniqueFunctionId = uVar11 + 1;
  pcVar24 = (char *)(ulong)coroutine;
  generics_00.tail = local_1f8.tail;
  generics_00.head = local_1f8.head;
  FunctionData::FunctionData
            (pFVar21,ctx->allocator,source,ctx->scope,coroutine,SUB81(local_238,0),isOperator,
             local_230,&local_240->super_TypeBase,pSVar20,generics_00,uVar11);
  (pFVar21->aliases).head = matches.head;
  (pFVar21->aliases).tail = matches.tail;
  if (local_1c8._8_4_ != 0) {
    lVar35 = 0;
    uVar37 = 0;
    do {
      puVar43 = (undefined8 *)((long)&((SynBase *)local_1c8._0_8_)->_vptr_SynBase + lVar35);
      uVar11 = (pFVar21->arguments).count;
      if (uVar11 == (pFVar21->arguments).max) {
        SmallArray<ArgumentData,_4U>::grow(&pFVar21->arguments,uVar11);
      }
      pAVar2 = (pFVar21->arguments).data;
      if (pAVar2 == (ArgumentData *)0x0) {
        pcVar24 = "void SmallArray<ArgumentData, 4>::push_back(const T &) [T = ArgumentData, N = 4]"
        ;
        goto LAB_001fd9c0;
      }
      uVar11 = (pFVar21->arguments).count;
      (pFVar21->arguments).count = uVar11 + 1;
      pSVar26 = (SynBase *)*puVar43;
      uVar7 = puVar43[1];
      pSVar20 = (SynIdentifier *)puVar43[2];
      pTVar14 = (TypeBase *)puVar43[3];
      pFVar22 = (FunctionData *)puVar43[5];
      pAVar2[uVar11].value = (ExprBase *)puVar43[4];
      (&pAVar2[uVar11].value)[1] = (ExprBase *)pFVar22;
      pAVar2[uVar11].name = pSVar20;
      (&pAVar2[uVar11].name)[1] = (SynIdentifier *)pTVar14;
      pAVar2[uVar11].source = pSVar26;
      *(undefined8 *)&pAVar2[uVar11].isExplicit = uVar7;
      uVar37 = uVar37 + 1;
      lVar35 = lVar35 + 0x30;
    } while (uVar37 < (uint)local_1c8._8_4_);
  }
  if (local_230->returnType == ctx->typeAuto) {
    pFVar22 = (FunctionData *)0x0;
  }
  else {
    pFVar22 = anon_unknown.dwarf_11255e::ImplementPrototype(ctx,pFVar21);
    if (pFVar22 == (FunctionData *)0x0) {
      pFVar22 = (FunctionData *)0x0;
    }
    else {
      if (prototype) {
        pcVar24 = "ERROR: function is already defined";
        goto LAB_001fdbb5;
      }
      if (coroutine) {
        if (pFVar22->coroutine != true) {
          pcVar24 = "ERROR: function prototype was not a coroutine";
          goto LAB_001fdbb5;
        }
        if (!coroutine) goto LAB_001fca65;
      }
      else {
LAB_001fca65:
        if (pFVar22->coroutine == true) {
          pcVar24 = "ERROR: function prototype was a coroutine";
LAB_001fdbb5:
          anon_unknown.dwarf_11255e::Stop(ctx,&source_00->super_SynBase,pcVar24);
        }
      }
      pFVar21->contextType = pFVar22->contextType;
      if ((pFVar21->arguments).count != 0) {
        lVar35 = 0x20;
        uVar37 = 0;
        do {
          if ((pFVar22->arguments).count <= uVar37) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<ArgumentData, 4>::operator[](unsigned int) [T = ArgumentData, N = 4]"
                         );
          }
          lVar3 = *(long *)((long)&((pFVar22->arguments).data)->source + lVar35);
          if (lVar3 != 0) {
            pAVar2 = (pFVar21->arguments).data;
            if (*(long *)((long)&pAVar2->source + lVar35) == 0) {
              *(long *)((long)&pAVar2->source + lVar35) = lVar3;
            }
            else {
              anon_unknown.dwarf_11255e::Report
                        (ctx,&source_00->super_SynBase,
                         "ERROR: function prototype already has a default value for argument #%d",
                         (ulong)((int)uVar37 + 1));
            }
          }
          uVar37 = uVar37 + 1;
          lVar35 = lVar35 + 0x30;
        } while (uVar37 < (pFVar21->arguments).count);
      }
    }
  }
  name_00.end = pcVar24;
  name_00.begin = (pFVar21->name->name).end;
  anon_unknown.dwarf_11255e::CheckFunctionConflict
            ((anon_unknown_dwarf_11255e *)ctx,(ExpressionContext *)source,
             (SynBase *)(pFVar21->name->name).begin,name_00);
  this = ctx;
  ExpressionContext::AddFunction(ctx,pFVar21);
  bVar10 = ExpressionContext::IsGenericFunction(this,pFVar21);
  if (bVar10) {
    if (instance != (TypeFunction *)0x0) {
      __assert_fail("!instance",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x23af,
                    "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                   );
    }
    if (prototype) {
      anon_unknown.dwarf_11255e::Stop
                (ctx,&source_00->super_SynBase,"ERROR: generic function cannot be forward-declared")
      ;
    }
    if (bVar9) {
      ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
    }
    if ((source == (SynBase *)0x0) || (source->typeID != 0x37)) {
      __assert_fail("isType<SynFunctionDefinition>(source)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x23b7,
                    "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                   );
    }
    if ((source == (SynBase *)0x0) ||
       (pSVar23 = (SynFunctionDefinition *)source, source->typeID != 0x37)) {
      pSVar23 = (SynFunctionDefinition *)0x0;
    }
    pFVar21->definition = pSVar23;
    iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar28 = (ExprBase *)CONCAT44(extraout_var_04,iVar12);
    pTVar18 = pFVar21->type;
    pEVar28->typeID = 0x25;
    pEVar28->source = source;
    pEVar28->type = &pTVar18->super_TypeBase;
    pEVar28->next = (ExprBase *)0x0;
    pEVar28->listed = false;
    pEVar28->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6cc8;
    pEVar28[1]._vptr_ExprBase = (_func_int **)pFVar21;
    *(undefined8 *)&pEVar28[1].typeID = 0;
    pEVar28[1].source = (SynBase *)0x0;
    pFVar21->declaration = pEVar28;
    if ((parentType_00 == (FunctionData *)0x0) || (*(int *)&parentType_00->importModule != 0x18)) {
      parentType_00 = (FunctionData *)0x0;
    }
    if ((parentType_00 != (FunctionData *)0x0) &&
       (pcVar24 = strstr((pFVar21->name->name).begin,"::"), pcVar24 != (char *)0x0)) {
      ppEVar5 = &(parentType_00->arguments).little[3].value;
      uVar11 = *(uint *)&(parentType_00->arguments).little[3].valueFunction;
      if (uVar11 == *(uint *)((long)&(parentType_00->arguments).little[3].valueFunction + 4)) {
        SmallArray<FunctionData_*,_4U>::grow((SmallArray<FunctionData_*,_4U> *)ppEVar5,uVar11);
      }
      pEVar28 = *ppEVar5;
      if (pEVar28 == (ExprBase *)0x0) {
LAB_001fdb7e:
        pcVar24 = 
        "void SmallArray<FunctionData *, 4>::push_back(const T &) [T = FunctionData *, N = 4]";
        goto LAB_001fd9c0;
      }
      uVar11 = *(uint *)&(parentType_00->arguments).little[3].valueFunction;
      *(uint *)&(parentType_00->arguments).little[3].valueFunction = uVar11 + 1;
      (&pEVar28->_vptr_ExprBase)[uVar11] = (_func_int **)pFVar21;
      sVar25 = strlen(pcVar24 + 2);
      uVar11 = NULLC::GetStringHash(pcVar24 + 2,pcVar24 + sVar25 + 2);
      DirectChainedMap<FunctionData_*>::insert
                ((DirectChainedMap<FunctionData_*> *)&parentType_00->instances,uVar11,pFVar21);
    }
  }
  else {
    if (isOperator) {
      pSVar40 = ctx->scope;
      if ((pSVar40->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
        pSVar40 = ctx->globalScope;
      }
      DirectChainedMap<IdentifierLookupResult>::remove
                (&pSVar40->idLookupMap,(char *)(ulong)pFVar21->nameHash);
    }
    if (genericProto != (FunctionData *)0x0) {
      pFVar21->proto = genericProto;
      uVar11 = (genericProto->instances).count;
      if (uVar11 == (genericProto->instances).max) {
        SmallArray<FunctionData_*,_8U>::grow(&genericProto->instances,uVar11);
      }
      ppFVar4 = (genericProto->instances).data;
      if (ppFVar4 == (FunctionData **)0x0) {
        pcVar24 = 
        "void SmallArray<FunctionData *, 8>::push_back(const T &) [T = FunctionData *, N = 8]";
        goto LAB_001fd9c0;
      }
      uVar11 = (genericProto->instances).count;
      (genericProto->instances).count = uVar11 + 1;
      ppFVar4[uVar11] = pFVar21;
    }
    ExpressionContext::PushScope(ctx,pFVar21);
    pFVar21->functionScope = ctx->scope;
    for (pMVar16 = (pFVar21->aliases).head; pMVar16 != (MatchData *)0x0; pMVar16 = pMVar16->next) {
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      alias = (AliasData *)CONCAT44(extraout_var_05,iVar12);
      pSVar40 = ctx->scope;
      pSVar20 = pMVar16->name;
      pTVar14 = pMVar16->type;
      uVar11 = ctx->uniqueAliasId;
      ctx->uniqueAliasId = uVar11 + 1;
      alias->source = source;
      alias->scope = pSVar40;
      alias->type = pTVar14;
      alias->name = pSVar20;
      alias->uniqueId = uVar11;
      alias->importModule = (ModuleData *)0x0;
      uVar11 = NULLC::GetStringHash((pSVar20->name).begin,(pSVar20->name).end);
      alias->nameHash = uVar11;
      ExpressionContext::AddAlias(ctx,alias);
    }
    local_1d8.head = (ExprVariableDefinition *)0x0;
    local_1d8.tail = (ExprVariableDefinition *)0x0;
    arguments_01.count = local_1c8._8_4_;
    arguments_01.data = (ArgumentData *)local_1c8._0_8_;
    arguments_01._12_4_ = 0;
    CreateFunctionArgumentVariables(ctx,source,pFVar21,arguments_01,&local_1d8);
    pSVar26 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    pEVar27 = CreateFunctionContextArgument(ctx,pSVar26,pFVar21);
    pFVar21->argumentsSize = pFVar21->functionScope->dataSize;
    local_228.head = (ExprBase *)0x0;
    local_228.tail = (ExprBase *)0x0;
    if (prototype) {
      if (pFVar21->type->returnType == ctx->typeAuto) {
        anon_unknown.dwarf_11255e::Stop
                  (ctx,&source_00->super_SynBase,
                   "ERROR: function prototype with unresolved return type");
      }
      pFVar21->isPrototype = true;
      local_270 = (ExprBase *)0x0;
    }
    else {
      if (pFVar21->coroutine == true) {
        uVar13 = anon_unknown.dwarf_11255e::AllocateVariableInScope
                           (ctx,source,ctx->typeInt->alignment,ctx->typeInt);
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar20 = (SynIdentifier *)CONCAT44(extraout_var_06,iVar12);
        (pSVar20->super_SynBase).typeID = 4;
        (pSVar20->super_SynBase).begin = (Lexeme *)0x0;
        (pSVar20->super_SynBase).end = (Lexeme *)0x0;
        (pSVar20->super_SynBase).pos.begin = (char *)0x0;
        (pSVar20->super_SynBase).pos.end = (char *)0x0;
        *(undefined8 *)((long)&(pSVar20->super_SynBase).pos.end + 2) = 0;
        *(undefined8 *)((long)&(pSVar20->super_SynBase).next + 2) = 0;
        (pSVar20->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
        (pSVar20->name).begin = "$jmpOffset";
        (pSVar20->name).end = "";
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        pVVar32 = (VariableData *)CONCAT44(extraout_var_07,iVar12);
        uVar11 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar11 + 1;
        VariableData::VariableData
                  (pVVar32,ctx->allocator,source,ctx->scope,0,ctx->typeInt,pSVar20,uVar13,uVar11);
        pFVar21->coroutineJumpOffset = pVVar32;
        bVar10 = anon_unknown.dwarf_11255e::IsLookupOnlyVariable(ctx,pVVar32);
        if (bVar10) {
          pVVar32->lookupOnly = true;
        }
        ExpressionContext::AddVariable(ctx,pVVar32,false);
        AddFunctionCoroutineVariable(ctx,source,pFVar21,pFVar21->coroutineJumpOffset);
        local_270 = CreateVariableAccess(ctx,source,pFVar21->coroutineJumpOffset,true);
      }
      else {
        local_270 = (ExprBase *)0x0;
      }
      classType = (TypeClass *)pFVar21->scope->ownerType;
      if ((classType == (TypeClass *)0x0) ||
         ((classType->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
        classType = (TypeClass *)0x0;
      }
      if (classType != (TypeClass *)0x0) {
        local_268.node = (Node)GetTypeConstructorName(classType);
        bVar10 = InplaceStr::operator==((InplaceStr *)&local_268,local_248);
        if (bVar10) {
          CreateDefaultConstructorCode(ctx,source,classType,&local_228);
        }
      }
      if (expressions.head != (SynBase *)0x0) {
        do {
          pEVar28 = AnalyzeStatement(ctx,expressions.head);
          IntrusiveList<ExprBase>::push_back(&local_228,pEVar28);
          expressions.head = (expressions.head)->next;
        } while (expressions.head != (SynBase *)0x0);
      }
      if (pFVar21->type->returnType == ctx->typeAuto) {
        pTVar18 = ExpressionContext::GetFunctionType
                            (ctx,source,ctx->typeVoid,pFVar21->type->arguments);
        pFVar21->type = pTVar18;
      }
      if ((pFVar21->type->returnType != ctx->typeVoid) && (pFVar21->hasExplicitReturn == false)) {
        anon_unknown.dwarf_11255e::Report
                  (ctx,&source_00->super_SynBase,
                   "ERROR: function must return a value of type \'%.*s\'");
      }
      if (pFVar21->type->returnType == ctx->typeVoid) {
        pSVar26 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar28 = (ExprBase *)CONCAT44(extraout_var_08,iVar12);
        local_238 = ctx->typeVoid;
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pp_Var29 = (_func_int **)CONCAT44(extraout_var_09,iVar12);
        pTVar14 = ctx->typeVoid;
        *(undefined4 *)(pp_Var29 + 1) = 2;
        pp_Var29[2] = (_func_int *)pSVar26;
        pp_Var29[3] = (_func_int *)pTVar14;
        pp_Var29[4] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var29 + 5) = 0;
        *pp_Var29 = (_func_int *)&PTR__ExprBase_003f6b40;
        local_240 = (TypeRef *)CreateFunctionCoroutineStateUpdate(ctx,pSVar26,pFVar21,0);
        pSVar30 = &ExpressionContext::MakeInternal(ctx,pSVar26)->super_SynBase;
        pSVar30 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar30,pFVar21,ctx->scope);
        pEVar28->typeID = 0x1c;
        pEVar28->source = pSVar26;
        pEVar28->type = local_238;
        pEVar28->next = (ExprBase *)0x0;
        pEVar28->listed = false;
        pEVar28->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6670;
        pEVar28[1]._vptr_ExprBase = pp_Var29;
        *(TypeRef **)&pEVar28[1].typeID = local_240;
        pEVar28[1].source = pSVar30;
        IntrusiveList<ExprBase>::push_back(&local_228,pEVar28);
      }
    }
    ClosePendingUpvalues(ctx,pFVar21);
    ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
    if (bVar9) {
      ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
    }
    if (parentType_00 == (FunctionData *)0x0) {
      if ((!coroutine) &&
         ((ctx->scope == ctx->globalScope || (ctx->scope->ownerNamespace != (NamespaceData *)0x0))))
      goto LAB_001fd2f3;
      if (prototype) {
        pTVar14 = pFVar21->contextType;
        if ((pTVar14 == (TypeBase *)0x0) || (pTVar14->typeID != 0x12)) {
          pTVar14 = (TypeBase *)0x0;
        }
        if (pTVar14 == (TypeBase *)0x0) {
          __assert_fail("refType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x244c,
                        "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                       );
        }
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar20 = (SynIdentifier *)CONCAT44(extraout_var_10,iVar12);
        IVar45 = GetFunctionContextVariableName(ctx,pFVar21,pFVar21->functionIndex);
        (pSVar20->super_SynBase).typeID = 4;
        (pSVar20->super_SynBase).begin = (Lexeme *)0x0;
        (pSVar20->super_SynBase).end = (Lexeme *)0x0;
        (pSVar20->super_SynBase).pos.begin = (char *)0x0;
        (pSVar20->super_SynBase).pos.end = (char *)0x0;
        *(undefined8 *)((long)&(pSVar20->super_SynBase).pos.end + 2) = 0;
        *(undefined8 *)((long)&(pSVar20->super_SynBase).next + 2) = 0;
        (pSVar20->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
        pSVar20->name = IVar45;
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
        pVVar32 = (VariableData *)CONCAT44(extraout_var_11,iVar12);
        uVar11 = pTVar14->alignment;
        uVar13 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar13 + 1;
        VariableData::VariableData
                  (pVVar32,ctx->allocator,source,ctx->scope,uVar11,pTVar14,pSVar20,0,uVar13);
        pVVar32->isAlloca = true;
        pVVar32->offset = 0xffffffff;
        ExpressionContext::AddVariable(ctx,pVVar32,true);
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar33 = (ExprVariableDefinition *)CONCAT44(extraout_var_12,iVar12);
        pTVar14 = ctx->typeVoid;
        iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pVVar31 = (VariableHandle *)CONCAT44(extraout_var_13,iVar12);
        pVVar31->source = (SynBase *)0x0;
        pVVar31->variable = pVVar32;
        pVVar31->next = (VariableHandle *)0x0;
        pVVar31->listed = false;
        (pEVar33->super_ExprBase).typeID = 0x1e;
        (pEVar33->super_ExprBase).source = source;
        (pEVar33->super_ExprBase).type = pTVar14;
        (pEVar33->super_ExprBase).next = (ExprBase *)0x0;
        (pEVar33->super_ExprBase).listed = false;
        (pEVar33->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f64e8;
        pEVar33->variable = pVVar31;
        pEVar33->initializer = (ExprBase *)0x0;
      }
      else {
        pVVar32 = CreateFunctionContextVariable(ctx,source,pFVar21,pFVar22);
        pEVar33 = CreateFunctionContextVariableDefinition(ctx,source,pFVar21,pFVar22,pVVar32);
      }
    }
    else {
      local_268.node = *(Node *)&parentType_00->isInternal;
      if (*(int *)&parentType_00->importModule == 0x18) {
        lVar35 = *(long *)&(parentType_00->arguments).little[2].isExplicit;
        if (lVar35 != 0) {
          local_268.node = *(Node *)(lVar35 + 0x10);
        }
        pcVar24 = strstr((pFVar21->name->name).begin,"::");
        if (pcVar24 != (char *)0x0) {
          ppEVar5 = &(parentType_00->arguments).little[3].value;
          uVar11 = *(uint *)&(parentType_00->arguments).little[3].valueFunction;
          if (uVar11 == *(uint *)((long)&(parentType_00->arguments).little[3].valueFunction + 4)) {
            SmallArray<FunctionData_*,_4U>::grow((SmallArray<FunctionData_*,_4U> *)ppEVar5,uVar11);
          }
          pEVar28 = *ppEVar5;
          if (pEVar28 == (ExprBase *)0x0) goto LAB_001fdb7e;
          uVar11 = *(uint *)&(parentType_00->arguments).little[3].valueFunction;
          *(uint *)&(parentType_00->arguments).little[3].valueFunction = uVar11 + 1;
          (&pEVar28->_vptr_ExprBase)[uVar11] = (_func_int **)pFVar21;
          sVar25 = strlen(pcVar24 + 2);
          uVar11 = NULLC::GetStringHash(pcVar24 + 2,pcVar24 + sVar25 + 2);
          parentType_00 = (FunctionData *)&parentType_00->instances;
          DirectChainedMap<FunctionData_*>::insert
                    ((DirectChainedMap<FunctionData_*> *)parentType_00,uVar11,pFVar21);
        }
      }
      bVar9 = InplaceStr::operator==(local_248,(InplaceStr *)&local_268);
      if ((bVar9) && (pFVar21->type->returnType != ctx->typeVoid)) {
        anon_unknown.dwarf_11255e::Stop
                  (ctx,&source_00->super_SynBase,
                   "ERROR: type constructor return type must be \'void\'");
      }
LAB_001fd2f3:
      pVVar32 = (VariableData *)0x0;
      pEVar33 = (ExprVariableDefinition *)0x0;
    }
    pFVar22 = anon_unknown.dwarf_11255e::ImplementPrototype(ctx,pFVar21);
    if (pFVar22 != (FunctionData *)0x0) {
      pTVar14 = pFVar21->contextType;
      if ((pTVar14 == (TypeBase *)0x0) || (pTVar14->typeID != 0x12)) {
        pTVar14 = (TypeBase *)0x0;
      }
      if (pTVar14 == (TypeBase *)0x0) {
        __assert_fail("refType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x2466,
                      "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                     );
      }
      pTVar14 = (TypeBase *)pTVar14[1]._vptr_TypeBase;
      if (pTVar14 != ctx->typeVoid) {
        if ((pTVar14 == (TypeBase *)0x0) || (pTVar14->typeID != 0x18)) {
          pTVar14 = (TypeBase *)0x0;
        }
        if (pTVar14 == (TypeBase *)0x0) {
          __assert_fail("classType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x246c,
                        "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                       );
        }
        lVar35._0_4_ = pTVar14[1].typeID;
        lVar35._4_4_ = pTVar14[1].nameHash;
        if (lVar35 != 0) {
          anon_unknown.dwarf_11255e::Report
                    (ctx,&source_00->super_SynBase,
                     "ERROR: function \'%.*s\' is being defined with the same set of arguments",
                     (ulong)(uint)(*(int *)&(pFVar21->name->name).end -
                                  (int)(pFVar21->name->name).begin));
        }
      }
    }
    if (isOperator) {
      pSVar40 = ctx->scope;
      if ((pSVar40->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
        pSVar40 = ctx->globalScope;
        uVar11 = NULLC::GetStringHash((pFVar21->name->name).begin,(pFVar21->name->name).end);
      }
      else {
        uVar11 = pFVar21->nameHash;
      }
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pFVar21;
      DirectChainedMap<IdentifierLookupResult>::insert
                (&pSVar40->idLookupMap,uVar11,(IdentifierLookupResult)(auVar6 << 0x40));
      (ctx->noAssignmentOperatorForTypePair).count = 0;
      NULLC::fillMemory((ctx->noAssignmentOperatorForTypePair).data,0,
                        (ulong)(ctx->noAssignmentOperatorForTypePair).bucketCount << 4);
      (ctx->noIndexOperatorForTypePair).count = 0;
      NULLC::fillMemory((ctx->noIndexOperatorForTypePair).data,0,
                        (ulong)(ctx->noIndexOperatorForTypePair).bucketCount << 4);
      lVar35 = 0;
      do {
        *(undefined4 *)((long)(ctx->noUnaryOperatorForTypePair).data[0].storage + lVar35 + -0xc) = 0
        ;
        NULLC::fillMemory(*(void **)((long)(ctx->noUnaryOperatorForTypePair).data[0].storage +
                                    lVar35 + -8),0,
                          (ulong)*(uint *)((long)(ctx->noUnaryOperatorForTypePair).data[0].storage +
                                          lVar35 + -0x10) << 3);
        lVar35 = lVar35 + 0x38;
      } while (lVar35 != 0xe0);
      lVar35 = 0;
      do {
        *(undefined4 *)((long)(ctx->noBinaryOperatorForTypePair).data[0].storage + lVar35 + -0xc) =
             0;
        NULLC::fillMemory(*(void **)((long)(ctx->noBinaryOperatorForTypePair).data[0].storage +
                                    lVar35 + -8),0,
                          (ulong)*(uint *)((long)&((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)
                                                  ((ctx->noBinaryOperatorForTypePair).data[0].
                                                   storage + -1))->bucketCount + lVar35) << 4);
        lVar35 = lVar35 + 0x58;
      } while (lVar35 != 0x738);
      lVar35 = 0;
      do {
        *(undefined4 *)((long)(ctx->noModifyOperatorForTypePair).data[0].storage + lVar35 + -0xc) =
             0;
        NULLC::fillMemory(*(void **)((long)(ctx->noModifyOperatorForTypePair).data[0].storage +
                                    lVar35 + -8),0,
                          (ulong)*(uint *)((long)&((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)
                                                  ((ctx->noModifyOperatorForTypePair).data[0].
                                                   storage + -1))->bucketCount + lVar35) << 4);
        lVar35 = lVar35 + 0x58;
      } while (lVar35 != 0x3c8);
    }
    uVar11 = NULLC::GetStringHash((pFVar21->name->name).begin,(pFVar21->name->name).end);
    anon_unknown.dwarf_11255e::LookupFunctionChainByName(&local_268,ctx,uVar11);
    if (local_268.node.node == (Node *)0x0) {
      pFVar22 = (FunctionData *)0x0;
    }
    else {
      do {
        pFVar22 = *(FunctionData **)(local_268.node.node + 0x10);
        if (pFVar22 == (FunctionData *)0x0 || pFVar22 == pFVar21) {
          anon_unknown.dwarf_11255e::FunctionLookupChain::next(&local_218,&local_268);
          local_268.scope = local_218.scope;
          local_268.node.node = local_218.node.node;
          local_268.node.start = local_218.node.start;
          bVar9 = false;
          pFVar22 = parentType_00;
        }
        else {
          pMVar16 = (pFVar22->generics).head;
          iVar12 = 0;
          iVar39 = 0;
          if (pMVar16 != (MatchData *)0x0) {
            iVar39 = 0;
            pMVar36 = pMVar16;
            do {
              iVar39 = iVar39 + 1;
              pMVar36 = pMVar36->next;
            } while (pMVar36 != (MatchData *)0x0);
          }
          pMVar36 = (pFVar21->generics).head;
          if (pMVar36 != (MatchData *)0x0) {
            iVar12 = 0;
            pMVar41 = pMVar36;
            do {
              iVar12 = iVar12 + 1;
              pMVar41 = pMVar41->next;
            } while (pMVar41 != (MatchData *)0x0);
          }
          if (iVar39 == iVar12) {
            bVar9 = pMVar16 == (MatchData *)0x0 || pMVar36 == (MatchData *)0x0;
            if (pMVar16 != (MatchData *)0x0 && pMVar36 != (MatchData *)0x0) {
              do {
                if (pMVar16->type != pMVar36->type) goto LAB_001fd777;
                pMVar36 = pMVar36->next;
                pMVar16 = pMVar16->next;
                bVar9 = pMVar36 == (MatchData *)0x0 || pMVar16 == (MatchData *)0x0;
              } while (pMVar36 != (MatchData *)0x0 && pMVar16 != (MatchData *)0x0);
            }
            if (((bVar9) && (pFVar22->type == pFVar21->type)) &&
               (pFVar22->scope->ownerType == pFVar21->scope->ownerType)) {
              bVar9 = true;
              goto LAB_001fd7a4;
            }
          }
LAB_001fd777:
          anon_unknown.dwarf_11255e::FunctionLookupChain::next(&local_218,&local_268);
          local_268.scope = local_218.scope;
          local_268.node.node = local_218.node.node;
          local_268.node.start = local_218.node.start;
          bVar9 = false;
          pFVar22 = parentType_00;
        }
LAB_001fd7a4:
        if (bVar9) goto LAB_001fd7d6;
        parentType_00 = pFVar22;
      } while (local_268.node.node != (Node *)0x0);
      pFVar22 = (FunctionData *)0x0;
    }
LAB_001fd7d6:
    if (pFVar22 != (FunctionData *)0x0) {
      anon_unknown.dwarf_11255e::Report
                (ctx,&source_00->super_SynBase,
                 "ERROR: function \'%.*s\' is being defined with the same set of arguments",
                 (ulong)(uint)(*(int *)&(pFVar21->name->name).end - (int)(pFVar21->name->name).begin
                              ));
      pcVar24 = ctx->errorBuf;
      sVar25 = strlen(pcVar24);
      pcVar24 = pcVar24 + sVar25;
      iVar12 = NULLC::SafeSprintf(pcVar24,(ulong)(ctx->errorBufSize - (int)sVar25),
                                  "previous definition here");
      anon_unknown.dwarf_11255e::AddRelatedErrorInfoWithLocation
                (ctx,pFVar22->source,pcVar24,pcVar24 + iVar12);
    }
    iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
    pEVar28 = (ExprBase *)CONCAT44(extraout_var_14,iVar12);
    pTVar18 = pFVar21->type;
    local_218.node.start = (Node *)local_1d8.head;
    local_218.node.node = (Node *)local_1d8.tail;
    local_268.node.node = (Node *)local_228.tail;
    local_268.node.start = (Node *)local_228.head;
    pEVar28->typeID = 0x24;
    pEVar28->source = source;
    pEVar28->type = &pTVar18->super_TypeBase;
    pEVar28->next = (ExprBase *)0x0;
    pEVar28->listed = false;
    pEVar28->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f66a8;
    pEVar28[1]._vptr_ExprBase = (_func_int **)pFVar21;
    *(ExprVariableDefinition **)&pEVar28[1].typeID = pEVar27;
    pEVar28[1].source = (SynBase *)local_1d8.head;
    pEVar28[1].type = (TypeBase *)local_1d8.tail;
    pEVar28[1].next = local_270;
    *(ExprBase **)&pEVar28[1].listed = local_228.head;
    pEVar28[2]._vptr_ExprBase = (_func_int **)local_228.tail;
    *(ExprVariableDefinition **)&pEVar28[2].typeID = pEVar33;
    pEVar28[2].source = (SynBase *)pVVar32;
    pFVar21->declaration = pEVar28;
    uVar11 = (ctx->definitions).count;
    if (uVar11 == (ctx->definitions).max) {
      SmallArray<ExprBase_*,_128U>::grow(&ctx->definitions,uVar11);
    }
    ppEVar5 = (ctx->definitions).data;
    if (ppEVar5 == (ExprBase **)0x0) {
      pcVar24 = "void SmallArray<ExprBase *, 128>::push_back(const T &) [T = ExprBase *, N = 128]";
LAB_001fd9c0:
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,pcVar24);
    }
    pEVar28 = pFVar21->declaration;
    uVar11 = (ctx->definitions).count;
    (ctx->definitions).count = uVar11 + 1;
    ppEVar5[uVar11] = pEVar28;
  }
  pEVar28 = pFVar21->declaration;
LAB_001fd92b:
  NULLC::TraceScope::~TraceScope(&local_1e8);
  SmallArray<ArgumentData,_8U>::~SmallArray((SmallArray<ArgumentData,_8U> *)local_1c8);
  return pEVar28;
}

Assistant:

ExprBase* CreateFunctionDefinition(ExpressionContext &ctx, SynBase *source, bool prototype, bool coroutine, TypeBase *parentType, bool accessor, TypeBase *returnType, bool isOperator, SynIdentifier *name, IntrusiveList<SynIdentifier> aliases, IntrusiveList<SynFunctionArgument> arguments, IntrusiveList<SynBase> expressions, FunctionData *genericProto, TypeFunction *instance, IntrusiveList<MatchData> matches)
{
	SynBase *errorLocation = name->begin ? name : source;

	bool addedParentScope = RestoreParentTypeScope(ctx, source, parentType);

	if(ctx.scope->ownerType && !parentType)
		parentType = ctx.scope->ownerType;

	if(parentType && coroutine)
		Stop(ctx, errorLocation, "ERROR: coroutine cannot be a member function");

	IntrusiveList<MatchData> generics;

	for(SynIdentifier *curr = aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
	{
		if(LookupTypeByName(ctx, curr->name.hash()))
			Stop(ctx, curr, "ERROR: there is already a type with the same name");

		for(SynIdentifier *prev = aliases.head; prev && prev != curr; prev = getType<SynIdentifier>(prev->next))
		{
			if(prev->name == curr->name)
				Stop(ctx, curr, "ERROR: there is already an alias with the same name");
		}

		TypeBase *target = NULL;

		for(MatchData *match = matches.head; match; match = match->next)
		{
			if(curr->name == match->name->name)
			{
				target = match->type;
				break;
			}
		}

		if(!target)
			target = ctx.GetGenericAliasType(curr);

		generics.push_back(new (ctx.get<MatchData>()) MatchData(curr, target));
	}

	SmallArray<ArgumentData, 8> argData(ctx.allocator);

	AnalyzeFunctionDefinitionArguments(ctx, arguments, parentType, instance, argData);

	// Check required operator properties
	if(isOperator)
		CheckOperatorName(ctx, source, name->name, argData);

	if(accessor && name->name == parentType->name)
		Stop(ctx, errorLocation, "ERROR: name '%.*s' is already taken for a type", FMT_ISTR(name->name));

	InplaceStr functionName = GetFunctionName(ctx, ctx.scope, parentType, name->name, isOperator, accessor);

	TRACE_SCOPE("analyze", "CreateFunctionDefinition");
	TRACE_LABEL2(functionName.begin, functionName.end);

	TypeBase *contextRefType = NULL;

	if(parentType)
		contextRefType = ctx.GetReferenceType(parentType);
	else if(!coroutine && (ctx.scope == ctx.globalScope || ctx.scope->ownerNamespace))
		contextRefType = ctx.GetReferenceType(ctx.typeVoid);
	else
		contextRefType = ctx.GetReferenceType(CreateFunctionContextType(ctx, source, functionName));

	if(isType<TypeError>(returnType))
	{
		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	for(unsigned i = 0; i < argData.size(); i++)
	{
		if(isType<TypeError>(argData[i].type))
		{
			if(addedParentScope)
				ctx.PopScope(SCOPE_TYPE);

			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
		}
	}

	TypeFunction *functionType = ctx.GetFunctionType(source, returnType, argData);

	if(instance)
		assert(functionType == instance);

	if(VariableData *variable = LookupVariableByName(ctx, functionName.hash()))
	{
		if(variable->scope == ctx.scope)
			Stop(ctx, errorLocation, "ERROR: name '%.*s' is already taken for a variable in current scope", FMT_ISTR(name->name));
	}

	if(TypeClass *classType = getType<TypeClass>(parentType))
	{
		if(name->name == InplaceStr("finalize"))
			classType->hasFinalizer = true;
	}

	SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name, functionName);

	FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, coroutine, accessor, isOperator, functionType, contextRefType, nameIdentifier, generics, ctx.uniqueFunctionId++);

	function->aliases = matches;

	// Fill in argument data
	for(unsigned i = 0; i < argData.size(); i++)
		function->arguments.push_back(argData[i]);

	FunctionData *implementedPrototype = NULL;

	// If the type is known, implement the prototype immediately
	if(functionType->returnType != ctx.typeAuto)
	{
		if(FunctionData *functionPrototype = ImplementPrototype(ctx, function))
		{
			if(prototype)
				Stop(ctx, errorLocation, "ERROR: function is already defined");

			if(coroutine && !functionPrototype->coroutine)
				Stop(ctx, errorLocation, "ERROR: function prototype was not a coroutine");

			if(!coroutine && functionPrototype->coroutine)
				Stop(ctx, errorLocation, "ERROR: function prototype was a coroutine");

			function->contextType = functionPrototype->contextType;

			// Assign default function arguments
			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &protoArg = functionPrototype->arguments[i];
				ArgumentData &implArg = function->arguments[i];

				if(protoArg.value)
				{
					if(!implArg.value)
						implArg.value = protoArg.value;
					else
						Report(ctx, errorLocation, "ERROR: function prototype already has a default value for argument #%d", i + 1);
				}
			}

			implementedPrototype = functionPrototype;
		}
	}

	CheckFunctionConflict(ctx, source, function->name->name);

	ctx.AddFunction(function);

	if(ctx.IsGenericFunction(function))
	{
		assert(!instance);

		if(prototype)
			Stop(ctx, errorLocation, "ERROR: generic function cannot be forward-declared");

		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		assert(isType<SynFunctionDefinition>(source));

		function->definition = getType<SynFunctionDefinition>(source);
		function->declaration = new (ctx.get<ExprGenericFunctionPrototype>()) ExprGenericFunctionPrototype(source, function->type, function);

		if(TypeClass *typeClass = getType<TypeClass>(parentType))
		{
			// Register type method
			if(const char *pos = strstr(function->name->name.begin, "::"))
			{
				typeClass->methods.push_back(function);
				typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), function);
			}
		}

		return function->declaration;
	}

	// Operator overloads can't be called recursively and become available at the end of the definition
	if (isOperator)
	{
		if(ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE)
			ctx.globalScope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
		else
			ctx.scope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
	}

	if(genericProto)
	{
		function->proto = genericProto;

		genericProto->instances.push_back(function);
	}

	ctx.PushScope(function);

	function->functionScope = ctx.scope;

	for(MatchData *curr = function->aliases.head; curr; curr = curr->next)
		ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, curr->type, curr->name, ctx.uniqueAliasId++));

	IntrusiveList<ExprVariableDefinition> variables;

	CreateFunctionArgumentVariables(ctx, source, function, argData, variables);

	ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

	function->argumentsSize = function->functionScope->dataSize;

	ExprBase *coroutineStateRead = NULL;

	IntrusiveList<ExprBase> code;

	if(prototype)
	{
		if(function->type->returnType == ctx.typeAuto)
			Stop(ctx, errorLocation, "ERROR: function prototype with unresolved return type");

		function->isPrototype = true;
	}
	else
	{
		if(function->coroutine)
		{
			unsigned offset = AllocateVariableInScope(ctx, source, ctx.typeInt->alignment, ctx.typeInt);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$jmpOffset"));

			function->coroutineJumpOffset = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, ctx.typeInt, nameIdentifier, offset, ctx.uniqueVariableId++);

			if (IsLookupOnlyVariable(ctx, function->coroutineJumpOffset))
				function->coroutineJumpOffset->lookupOnly = true;

			ctx.AddVariable(function->coroutineJumpOffset, false);

			AddFunctionCoroutineVariable(ctx, source, function, function->coroutineJumpOffset);

			coroutineStateRead = CreateVariableAccess(ctx, source, function->coroutineJumpOffset, true);
		}

		// If this is a custom default constructor, add a prolog
		if(TypeClass *classType = getType<TypeClass>(function->scope->ownerType))
		{
			if(GetTypeConstructorName(classType) == name->name)
				CreateDefaultConstructorCode(ctx, source, classType, code);
		}

		for(SynBase *expression = expressions.head; expression; expression = expression->next)
			code.push_back(AnalyzeStatement(ctx, expression));

		// If the function type is still auto it means that it hasn't returned anything
		if(function->type->returnType == ctx.typeAuto)
			function->type = ctx.GetFunctionType(source, ctx.typeVoid, function->type->arguments);

		if(function->type->returnType != ctx.typeVoid && !function->hasExplicitReturn)
			Report(ctx, errorLocation, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		// User might have not returned from all control paths, for a void function we will generate a return
		if(function->type->returnType == ctx.typeVoid)
		{
			SynBase *location = ctx.MakeInternal(source);

			code.push_back(new (ctx.get<ExprReturn>()) ExprReturn(location, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(location, ctx.typeVoid), CreateFunctionCoroutineStateUpdate(ctx, location, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(location), function, ctx.scope)));
		}
	}

	ClosePendingUpvalues(ctx, function);

	ctx.PopScope(SCOPE_FUNCTION);

	if(addedParentScope)
		ctx.PopScope(SCOPE_TYPE);

	if(parentType)
	{
		InplaceStr parentName = parentType->name;

		if(TypeClass *typeClass = getType<TypeClass>(parentType))
		{
			if(typeClass->proto)
				parentName = typeClass->proto->name;

			// Register type method
			if(const char *pos = strstr(function->name->name.begin, "::"))
			{
				typeClass->methods.push_back(function);
				typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), function);
			}
		}

		if(name->name == parentName && function->type->returnType != ctx.typeVoid)
			Stop(ctx, errorLocation, "ERROR: type constructor return type must be 'void'");
	}

	VariableData *contextVariable = NULL;
	ExprVariableDefinition *contextVariableDefinition = NULL;

	if(parentType)
	{
		contextVariableDefinition = NULL;
	}
	else if(!coroutine && (ctx.scope == ctx.globalScope || ctx.scope->ownerNamespace))
	{
		contextVariableDefinition = NULL;
	}
	else if(prototype)
	{
		TypeRef *refType = getType<TypeRef>(function->contextType);

		assert(refType);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(GetFunctionContextVariableName(ctx, function, ctx.GetFunctionIndex(function)));

		contextVariable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, refType->alignment, refType, nameIdentifier, 0, ctx.uniqueVariableId++);

		contextVariable->isAlloca = true;
		contextVariable->offset = ~0u;

		//function->contextVariable = context;

		ctx.AddVariable(contextVariable, true);

		contextVariableDefinition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, contextVariable), NULL);
	}
	else
	{
		contextVariable = CreateFunctionContextVariable(ctx, source, function, implementedPrototype);
		contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, source, function, implementedPrototype, contextVariable);
	}

	// If the type was deduced, implement prototype now that it's known
	if(ImplementPrototype(ctx, function))
	{
		TypeRef *refType = getType<TypeRef>(function->contextType);

		assert(refType);

		if(refType->subType != ctx.typeVoid)
		{
			TypeClass *classType = getType<TypeClass>(refType->subType);

			assert(classType);

			if(!classType->members.empty())
				Report(ctx, errorLocation, "ERROR: function '%.*s' is being defined with the same set of arguments", FMT_ISTR(function->name->name));
		}
	}

	// Time to make operator overload visible
	if(isOperator)
	{
		if(ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE)
			ctx.globalScope->idLookupMap.insert(function->name->name.hash(), IdentifierLookupResult(function));
		else
			ctx.scope->idLookupMap.insert(function->nameHash, IdentifierLookupResult(function));

		// TODO: more precise invalidation
		ctx.noAssignmentOperatorForTypePair.clear();

		ctx.noIndexOperatorForTypePair.clear();

		for(unsigned i = 0; i < ctx.noUnaryOperatorForTypePair.size(); i++)
			ctx.noUnaryOperatorForTypePair[i].clear();

		for(unsigned i = 0; i < ctx.noBinaryOperatorForTypePair.size(); i++)
			ctx.noBinaryOperatorForTypePair[i].clear();

		for(unsigned i = 0; i < ctx.noModifyOperatorForTypePair.size(); i++)
			ctx.noModifyOperatorForTypePair[i].clear();
	}

	FunctionData *conflict = CheckUniqueness(ctx, function);

	if(conflict)
	{
		Report(ctx, errorLocation, "ERROR: function '%.*s' is being defined with the same set of arguments", FMT_ISTR(function->name->name));

		char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

		const char *messageStart = errorCurr;

		errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "previous definition here");

		const char *messageEnd = errorCurr;

		AddRelatedErrorInfoWithLocation(ctx, conflict->source, messageStart, messageEnd);
	}

	function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, variables, coroutineStateRead, code, contextVariableDefinition, contextVariable);

	ctx.definitions.push_back(function->declaration);

	return function->declaration;
}